

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O1

put_transaction<void> * __thiscall
density::
lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
::start_dyn_push_copy
          (put_transaction<void> *__return_storage_ptr__,
          lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          *this,runtime_type *i_type,void *i_source)

{
  tuple_type *ptVar1;
  Allocation push_data;
  Allocation local_48;
  
  ptVar1 = (i_type->m_underlying_type).m_feature_table;
  detail::
  LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0>
            (&local_48,
             (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
              *)this,1,true,
             (ptVar1->
             super__Tuple_impl<0UL,_density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>
             ).super__Head_base<0UL,_density::f_size,_false>._M_head_impl.m_size,
             (ptVar1->
             super__Tuple_impl<0UL,_density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>
             ).
             super__Tuple_impl<1UL,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>
             .super__Head_base<1UL,_density::f_alignment,_false>._M_head_impl.m_alignment);
  density_tests::
  TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
  ::TestRuntimeTime((TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
                     *)(local_48.m_control_block + 1),i_type);
  density_tests::
  TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
  ::copy_construct(i_type,local_48.m_user_storage,i_source);
  (__return_storage_ptr__->m_put).m_control_block = local_48.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_48.m_next_ptr;
  (__return_storage_ptr__->m_put).m_user_storage = local_48.m_user_storage;
  __return_storage_ptr__->m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)this;
  return __return_storage_ptr__;
}

Assistant:

put_transaction<> start_dyn_push_copy(const runtime_type & i_type, const void * i_source)
        {
            auto push_data = Base::template try_inplace_allocate_impl<detail::LfQueue_Throwing>(
              detail::LfQueue_Busy, true, i_type.size(), i_type.alignment());

            runtime_type * type = nullptr;
            try
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(i_type);

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                i_type.copy_construct(push_data.m_user_storage, i_source);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                Base::cancel_put_nodestroy_impl(push_data);
                throw;
            }

            return put_transaction<void>(PrivateType(), this, push_data);
        }